

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O0

void Emb_ManStop(Emb_Man_t *p)

{
  Emb_Man_t *p_local;
  
  Vec_IntFree(p->vCis);
  Vec_IntFree(p->vCos);
  if (p->pPlacement != (unsigned_short *)0x0) {
    free(p->pPlacement);
    p->pPlacement = (unsigned_short *)0x0;
  }
  if (p->pVecs != (Emb_Dat_t *)0x0) {
    free(p->pVecs);
    p->pVecs = (Emb_Dat_t *)0x0;
  }
  if (p->pSols != (float *)0x0) {
    free(p->pSols);
    p->pSols = (float *)0x0;
  }
  if (p->pMatr != (float **)0x0) {
    free(p->pMatr);
    p->pMatr = (float **)0x0;
  }
  if (p->pEigen != (float **)0x0) {
    free(p->pEigen);
    p->pEigen = (float **)0x0;
  }
  if (p->pObjData != (int *)0x0) {
    free(p->pObjData);
    p->pObjData = (int *)0x0;
  }
  if (p != (Emb_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Emb_ManStop( Emb_Man_t * p )
{
    Vec_IntFree( p->vCis );
    Vec_IntFree( p->vCos );
    ABC_FREE( p->pPlacement );
    ABC_FREE( p->pVecs );
    ABC_FREE( p->pSols );
    ABC_FREE( p->pMatr );
    ABC_FREE( p->pEigen );
    ABC_FREE( p->pObjData );
    ABC_FREE( p );
}